

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int WebRtcIsac_DecodeLb(TransformTables *transform_tables,float *signal_out,
                       ISACLBDecStruct *ISACdecLB_obj,int16_t *current_framesamples,
                       int16_t isRCUPayload)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  undefined6 in_register_00000082;
  int iVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  int16_t PitchGains_Q12 [4];
  int16_t bandwidthInd;
  double PitchGains [4];
  double PitchLags [4];
  double hi_filt_coef [42];
  double lo_filt_coef [78];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  float HP_dec_float [240];
  float LP_dec_float [240];
  double imag_f [240];
  double real_f [240];
  undefined4 local_31a0;
  short local_319c;
  short local_319a;
  undefined4 local_3198;
  int16_t local_3192;
  ulong local_3190;
  PostFiltBankstr *local_3188;
  float *local_3180;
  float *local_3178;
  float *local_3170;
  float *local_3168;
  PitchFiltstr *local_3160;
  FFTstr *local_3158;
  TransformTables *local_3150;
  float *local_3148;
  ulong local_3140;
  double local_3138 [4];
  double local_3118 [4];
  double local_30f8 [42];
  double local_2fa8 [78];
  double local_2d38 [720];
  float local_16b8 [240];
  float local_12f8 [240];
  double local_f38 [240];
  double local_7b8 [241];
  
  local_3150 = transform_tables;
  local_3148 = signal_out;
  WebRtcIsac_ResetBitstream(&ISACdecLB_obj->bitstr_obj);
  iVar2 = WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,current_framesamples);
  if (-1 < iVar2) {
    sVar8 = *current_framesamples;
    iVar2 = WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj,&local_3192);
    if (-1 < iVar2) {
      local_3198 = (undefined4)CONCAT62(in_register_00000082,isRCUPayload);
      iVar2 = 0;
      if (-0x3c0 < sVar8) {
        uVar3 = ((uint)(sVar8 * -0x7777) >> 0x10) + (int)sVar8;
        local_3158 = &ISACdecLB_obj->fftstr_obj;
        local_3160 = &ISACdecLB_obj->pitchfiltstr_obj;
        local_3168 = (ISACdecLB_obj->maskfiltstr_obj).PostStateLoF;
        local_3170 = (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG;
        local_3178 = (ISACdecLB_obj->maskfiltstr_obj).PostStateHiF;
        local_3180 = (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG;
        local_3188 = &ISACdecLB_obj->postfiltbankstr_obj;
        local_3190 = (ulong)((int)(short)(((short)uVar3 >> 9) + (short)((uVar3 & 0xffff) >> 0xf)) +
                            1);
        uVar11 = 0;
        do {
          iVar2 = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,(int16_t *)&local_31a0);
          if (iVar2 < 0) {
            return iVar2;
          }
          iVar2 = WebRtcIsac_DecodePitchLag
                            (&ISACdecLB_obj->bitstr_obj,(int16_t *)&local_31a0,local_3138 + 4);
          if (iVar2 < 0) {
            return iVar2;
          }
          iVar6 = (int)(short)local_31a0;
          iVar7 = (int)local_31a0._2_2_;
          iVar9 = (int)local_319c;
          iVar10 = (int)local_319a;
          local_3140 = uVar11;
          iVar2 = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj,local_2fa8,local_30f8);
          if (iVar2 < 0) {
            return iVar2;
          }
          sVar8 = (short)((uint)(iVar9 + iVar10 + iVar7 + iVar6) >> 2);
          iVar2 = WebRtcIsac_DecodeSpec
                            (&ISACdecLB_obj->bitstr_obj,sVar8,kIsacLowerBand,local_7b8,local_f38);
          if (iVar2 < 0) {
            return iVar2;
          }
          WebRtcIsac_Spec2time
                    (local_3150,local_7b8,local_f38,local_2d38 + 0x1e0,local_2d38 + 0xf0,local_3158)
          ;
          uVar11 = local_3140;
          lVar4 = 0;
          do {
            auVar13 = ZEXT416(*(uint *)((long)&local_31a0 + lVar4 * 2));
            auVar13 = pshuflw(auVar13,auVar13,0x60);
            local_3138[lVar4] = (double)((float)(auVar13._0_4_ >> 0x10) * 0.00024414062);
            local_3138[lVar4 + 1] = (double)((float)(auVar13._4_4_ >> 0x10) * 0.00024414062);
            lVar4 = lVar4 + 2;
          } while (lVar4 != 4);
          sVar5 = (short)local_3198;
          if (sVar5 != 0) {
            lVar4 = 0;
            do {
              local_2d38[lVar4 + 0x1e0] = local_2d38[lVar4 + 0x1e0] * 2.5;
              local_2d38[lVar4 + 0x1e1] = local_2d38[lVar4 + 0x1e1] * 2.5;
              local_2d38[lVar4 + 0xf0] = local_2d38[lVar4 + 0xf0] * 2.5;
              local_2d38[lVar4 + 0xf1] = local_2d38[lVar4 + 0xf1] * 2.5;
              lVar4 = lVar4 + 2;
            } while (lVar4 != 0xf0);
          }
          WebRtcIsac_PitchfilterPost
                    (local_2d38 + 0x1e0,local_2d38,local_3160,local_3138 + 4,local_3138);
          dVar12 = (double)((float)(int)sVar8 * 0.00024414062 * -0.45 + 1.0);
          lVar4 = 0;
          do {
            dVar1 = local_2d38[lVar4 + 1] * dVar12;
            auVar13._8_4_ = SUB84(dVar1,0);
            auVar13._0_8_ = local_2d38[lVar4] * dVar12;
            auVar13._12_4_ = (int)((ulong)dVar1 >> 0x20);
            *(undefined1 (*) [16])(local_2d38 + lVar4) = auVar13;
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0xf0);
          if (sVar5 != 0) {
            lVar4 = 0;
            do {
              local_2d38[lVar4] = local_2d38[lVar4] * 0.4000000059604645;
              local_2d38[lVar4 + 1] = local_2d38[lVar4 + 1] * 0.4000000059604645;
              local_2d38[lVar4 + 0xf0] = local_2d38[lVar4 + 0xf0] * 0.4000000059604645;
              local_2d38[lVar4 + 0xf1] = local_2d38[lVar4 + 0xf1] * 0.4000000059604645;
              lVar4 = lVar4 + 2;
            } while (lVar4 != 0xf0);
          }
          WebRtcIsac_NormLatticeFilterAr(0xc,local_3168,local_3170,local_2d38,local_2fa8,local_12f8)
          ;
          WebRtcIsac_NormLatticeFilterAr
                    (6,local_3178,local_3180,local_2d38 + 0xf0,local_30f8,local_16b8);
          WebRtcIsac_FilterAndCombineFloat
                    (local_12f8,local_16b8,local_3148 + uVar11 * 0x1e0,local_3188);
          uVar11 = uVar11 + 1;
        } while (uVar11 != local_3190);
      }
    }
  }
  return iVar2;
}

Assistant:

int WebRtcIsac_DecodeLb(const TransformTables* transform_tables,
                        float* signal_out, ISACLBDecStruct* ISACdecLB_obj,
                        int16_t* current_framesamples,
                        int16_t isRCUPayload) {
  int k;
  int len, err;
  int16_t bandwidthInd;

  float LP_dec_float[FRAMESAMPLES_HALF];
  float HP_dec_float[FRAMESAMPLES_HALF];

  double LPw[FRAMESAMPLES_HALF];
  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];

  double lo_filt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hi_filt_coef[(ORDERHI + 1)*SUBFRAMES];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];

  double PitchLags[4];
  double PitchGains[4];
  double AvgPitchGain;
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  float gain;

  int frame_nb; /* counter */
  int frame_mode; /* 0 30ms, 1 for 60ms */
  /* Processed_samples: 480 (30, 60 ms). Cannot take other values. */

  WebRtcIsac_ResetBitstream(&(ISACdecLB_obj->bitstr_obj));

  len = 0;

  /* Decode framelength and BW estimation - not used,
     only for stream pointer*/
  err = WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,
                                  current_framesamples);
  if (err < 0) {
    return err;
  }

  /* Frame_mode:
   * 0: indicates 30 ms frame (480 samples)
   * 1: indicates 60 ms frame (960 samples) */
  frame_mode = *current_framesamples / MAX_FRAMESAMPLES;

  err = WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj, &bandwidthInd);
  if (err < 0) {
    return err;
  }

  /* One loop if it's one frame (20 or 30ms), 2 loops if 2 frames
     bundled together (60ms). */
  for (frame_nb = 0; frame_nb <= frame_mode; frame_nb++) {
    /* Decode & de-quantize pitch parameters */
    err = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,
                                     PitchGains_Q12);
    if (err < 0) {
      return err;
    }

    err = WebRtcIsac_DecodePitchLag(&ISACdecLB_obj->bitstr_obj, PitchGains_Q12,
                                    PitchLags);
    if (err < 0) {
      return err;
    }

    AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
        PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

    /* Decode & de-quantize filter coefficients. */
    err = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj, lo_filt_coef,
                               hi_filt_coef);
    if (err < 0) {
      return err;
    }
    /* Decode & de-quantize spectrum. */
    len = WebRtcIsac_DecodeSpec(&ISACdecLB_obj->bitstr_obj, AvgPitchGain_Q12,
                                kIsacLowerBand, real_f, imag_f);
    if (len < 0) {
      return len;
    }

    /* Inverse transform. */
    WebRtcIsac_Spec2time(transform_tables, real_f, imag_f, LPw, HPw,
                         &ISACdecLB_obj->fftstr_obj);

    /* Convert PitchGains back to float for pitchfilter_post */
    for (k = 0; k < 4; k++) {
      PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
    }
    if (isRCUPayload) {
      for (k = 0; k < 240; k++) {
        LPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
        HPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
      }
    }

    /* Inverse pitch filter. */
    WebRtcIsac_PitchfilterPost(LPw, LPw_pf, &ISACdecLB_obj->pitchfiltstr_obj,
                               PitchLags, PitchGains);
    /* Convert AvgPitchGain back to float for computation of gain. */
    AvgPitchGain = ((float)AvgPitchGain_Q12) / 4096;
    gain = 1.0f - 0.45f * (float)AvgPitchGain;

    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      /* Reduce gain to compensate for pitch enhancer. */
      LPw_pf[k] *= gain;
    }

    if (isRCUPayload) {
      for (k = 0; k < FRAMESAMPLES_HALF; k++) {
        /* Compensation for transcoding gain changes. */
        LPw_pf[k] *= RCU_TRANSCODING_SCALE;
        HPw[k] *= RCU_TRANSCODING_SCALE;
      }
    }
    /* Perceptual post-filtering (using normalized lattice filter). */
    WebRtcIsac_NormLatticeFilterAr(
        ORDERLO, ISACdecLB_obj->maskfiltstr_obj.PostStateLoF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG, LPw_pf, lo_filt_coef,
        LP_dec_float);
    WebRtcIsac_NormLatticeFilterAr(
        ORDERHI, ISACdecLB_obj->maskfiltstr_obj.PostStateHiF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG, HPw, hi_filt_coef,
        HP_dec_float);

    /* Recombine the 2 bands. */
    WebRtcIsac_FilterAndCombineFloat(LP_dec_float, HP_dec_float,
                                     signal_out + frame_nb * FRAMESAMPLES,
                                     &ISACdecLB_obj->postfiltbankstr_obj);
  }
  return len;
}